

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::analysis::ConstantManager::CreateInstruction
          (ConstantManager *this,uint32_t id,Constant *c,uint32_t type_id)

{
  bool bVar1;
  int iVar2;
  uint32_t type_id_00;
  IRContext *this_00;
  TypeManager *this_01;
  Type *type_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  ConstantManager *this_02;
  uint32_t in_R8D;
  Operand *local_1c8;
  Operand *local_1b0;
  uint32_t local_19c;
  CompositeConstant *cc;
  Operand local_150;
  undefined1 local_120 [40];
  FloatConstant *fc;
  Operand local_d0;
  undefined1 local_a0 [40];
  IntConstant *ic;
  Op local_64;
  IRContext *local_60;
  BoolConstant *local_58;
  BoolConstant *bc;
  Op local_3c;
  IRContext *local_38;
  uint32_t local_30 [2];
  uint32_t type;
  uint32_t type_id_local;
  Constant *c_local;
  ConstantManager *pCStack_18;
  uint32_t id_local;
  ConstantManager *this_local;
  
  this_02 = (ConstantManager *)CONCAT44(in_register_00000034,id);
  _type = (Constant *)CONCAT44(in_register_0000000c,type_id);
  c_local._4_4_ = (uint)c;
  local_19c = in_R8D;
  pCStack_18 = this_02;
  this_local = this;
  if (in_R8D == 0) {
    this_00 = context(this_02);
    this_01 = IRContext::get_type_mgr(this_00);
    type_00 = Constant::type(_type);
    local_19c = TypeManager::GetId(this_01,type_00);
  }
  local_30[0] = local_19c;
  iVar2 = (*_type->_vptr_Constant[0x16])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    iVar2 = (*_type->_vptr_Constant[0x10])();
    local_58 = (BoolConstant *)CONCAT44(extraout_var_00,iVar2);
    if (local_58 == (BoolConstant *)0x0) {
      iVar2 = (*_type->_vptr_Constant[0xe])();
      local_a0._32_8_ = CONCAT44(extraout_var_01,iVar2);
      if ((uint *)local_a0._32_8_ == (uint *)0x0) {
        iVar2 = (*_type->_vptr_Constant[0xf])();
        local_120._32_8_ = CONCAT44(extraout_var_02,iVar2);
        if ((uint *)local_120._32_8_ == (uint *)0x0) {
          type_id_00 = (*_type->_vptr_Constant[0x11])();
          if (CONCAT44(extraout_var_03,type_id_00) == 0) {
            std::
            unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
            unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                      ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                        *)this,(nullptr_t)0x0);
          }
          else {
            CreateCompositeInstruction(this,id,(CompositeConstant *)(ulong)c_local._4_4_,type_id_00)
            ;
          }
        }
        else {
          local_120._24_8_ = context(this_02);
          local_120._20_4_ = 0x2b;
          pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (**(code **)(*(long *)local_120._32_8_ + 0xc0))();
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&cc,pvVar3);
          Operand::Operand(&local_150,SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,(OperandData *)&cc);
          local_120._0_8_ = &local_150;
          local_120._8_8_ = (_func_int **)0x1;
          MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
                    ((spvtools *)this,(IRContext **)(local_120 + 0x18),(Op *)(local_120 + 0x14),
                     local_30,(uint *)((long)&c_local + 4),
                     (initializer_list<spvtools::opt::Operand> *)local_120);
          local_1c8 = (Operand *)local_120;
          do {
            local_1c8 = local_1c8 + -1;
            Operand::~Operand(local_1c8);
          } while (local_1c8 != &local_150);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&cc)
          ;
        }
      }
      else {
        local_a0._24_8_ = context(this_02);
        local_a0._20_4_ = 0x2b;
        pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 (**(code **)(*(long *)local_a0._32_8_ + 0xc0))();
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&fc,pvVar3);
        Operand::Operand(&local_d0,SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,(OperandData *)&fc);
        local_a0._0_8_ = &local_d0;
        local_a0._8_8_ = (_func_int **)0x1;
        MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
                  ((spvtools *)this,(IRContext **)(local_a0 + 0x18),(Op *)(local_a0 + 0x14),local_30
                   ,(uint *)((long)&c_local + 4),
                   (initializer_list<spvtools::opt::Operand> *)local_a0);
        local_1b0 = (Operand *)local_a0;
        do {
          local_1b0 = local_1b0 + -1;
          Operand::~Operand(local_1b0);
        } while (local_1b0 != &local_d0);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&fc);
      }
    }
    else {
      local_60 = context(this_02);
      bVar1 = BoolConstant::value(local_58);
      local_64 = OpConstantFalse;
      if (bVar1) {
        local_64 = OpConstantTrue;
      }
      std::initializer_list<spvtools::opt::Operand>::initializer_list
                ((initializer_list<spvtools::opt::Operand> *)&ic);
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)this,&local_60,&local_64,local_30,(uint *)((long)&c_local + 4),
                 (initializer_list<spvtools::opt::Operand> *)&ic);
    }
  }
  else {
    local_38 = context(this_02);
    local_3c = OpConstantNull;
    std::initializer_list<spvtools::opt::Operand>::initializer_list
              ((initializer_list<spvtools::opt::Operand> *)&bc);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)this,&local_38,&local_3c,local_30,(uint *)((long)&c_local + 4),
               (initializer_list<spvtools::opt::Operand> *)&bc);
  }
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> ConstantManager::CreateInstruction(
    uint32_t id, const Constant* c, uint32_t type_id) const {
  uint32_t type =
      (type_id == 0) ? context()->get_type_mgr()->GetId(c->type()) : type_id;
  if (c->AsNullConstant()) {
    return MakeUnique<Instruction>(context(), spv::Op::OpConstantNull, type, id,
                                   std::initializer_list<Operand>{});
  } else if (const BoolConstant* bc = c->AsBoolConstant()) {
    return MakeUnique<Instruction>(
        context(),
        bc->value() ? spv::Op::OpConstantTrue : spv::Op::OpConstantFalse, type,
        id, std::initializer_list<Operand>{});
  } else if (const IntConstant* ic = c->AsIntConstant()) {
    return MakeUnique<Instruction>(
        context(), spv::Op::OpConstant, type, id,
        std::initializer_list<Operand>{
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
                    ic->words())});
  } else if (const FloatConstant* fc = c->AsFloatConstant()) {
    return MakeUnique<Instruction>(
        context(), spv::Op::OpConstant, type, id,
        std::initializer_list<Operand>{
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
                    fc->words())});
  } else if (const CompositeConstant* cc = c->AsCompositeConstant()) {
    return CreateCompositeInstruction(id, cc, type_id);
  } else {
    return nullptr;
  }
}